

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O0

void __thiscall
DifferentialEquation::DifferentialEquation
          (DifferentialEquation *this,Time *time,double x0,double dx0,string *name,string *type)

{
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_99;
  string local_98;
  vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_> local_78;
  vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_> local_58;
  string *local_38;
  string *type_local;
  string *name_local;
  double dx0_local;
  double x0_local;
  Time *time_local;
  DifferentialEquation *this_local;
  
  local_38 = type;
  type_local = name;
  name_local = (string *)dx0;
  dx0_local = x0;
  x0_local = (double)time;
  time_local = (Time *)this;
  StochasticVariable::StochasticVariable(&this->super_StochasticVariable,time,name,type);
  (this->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DifferentialEquation_0018e8c0;
  (this->super_StochasticVariable).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__DifferentialEquation_0018e950;
  (this->super_StochasticVariable).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__DifferentialEquation_0018e998;
  std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::vector
            (&this->eqnIntegrands);
  std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::vector
            (&this->eqnIntegrators);
  this->eqnX0 = dx0_local;
  this->eqnTermAmount = 0;
  local_58.super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::vector(&local_58);
  std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::operator=
            (&this->eqnIntegrands,&local_58);
  std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::~vector(&local_58);
  this->eqnTermAmount = 0;
  local_78.super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::vector(&local_78);
  std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::operator=
            (&this->eqnIntegrators,&local_78);
  std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::~vector(&local_78);
  this->eqnMethodPtr = (offset_in_DifferentialEquation_to_subr)stepEulerIto;
  *(undefined8 *)&this->field_0x158 = 0;
  (this->super_StochasticVariable).super_StochasticProcess.stochNextValue = dx0_local;
  (this->super_StochasticVariable).super_StochasticProcess.stochCurrentValue = dx0_local;
  this->eqnIncrement = (double)name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"equation",&local_99);
  Parametric::addParameter((Parametric *)this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"mode",&local_d1);
  Parametric::addParameter((Parametric *)this,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"starting-value",&local_f9)
  ;
  Parametric::addParameter((Parametric *)this,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  return;
}

Assistant:

DifferentialEquation::DifferentialEquation(Time *time, double x0, double dx0, const string& name, const string& type)
	: StochasticVariable(time, name, type)
{
	eqnX0 = x0;
	eqnTermAmount = 0;
	eqnIntegrands = vector<StochasticFunction *>();
	eqnTermAmount = 0;
	eqnIntegrators = vector<StochasticVariable *>();
	eqnMethodPtr = &DifferentialEquation::stepEulerIto;
	stochCurrentValue = stochNextValue = x0;
	eqnIncrement = dx0;
	addParameter("equation");
	addParameter("mode");
	addParameter("starting-value");
}